

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Apu.cpp
# Opt level: O2

void __thiscall Nes_Apu::enable_nonlinear(Nes_Apu *this,double v)

{
  (this->dmc).nonlinear = true;
  Blip_Synth_::volume_unit(&(this->square_synth).impl,v * 0.007514724138480537);
  Blip_Synth_::volume_unit(&(this->triangle).synth.impl,0.005346534653465346);
  Blip_Synth_::volume_unit(&(this->noise).synth.impl,0.003564356435643564);
  Blip_Synth_::volume_unit(&(this->dmc).synth.impl,0.001782178217821782);
  (this->square1).super_Nes_Envelope.super_Nes_Osc.last_amp = 0;
  (this->square2).super_Nes_Envelope.super_Nes_Osc.last_amp = 0;
  (this->triangle).super_Nes_Osc.last_amp = 0;
  (this->noise).super_Nes_Envelope.super_Nes_Osc.last_amp = 0;
  (this->dmc).super_Nes_Osc.last_amp = 0;
  return;
}

Assistant:

void Nes_Apu::enable_nonlinear( double v )
{
	dmc.nonlinear = true;
	square_synth.volume( 1.3 * 0.25751258 / 0.742467605 * 0.25 / amp_range * v );
	
	const double tnd = 0.48 / 202 * nonlinear_tnd_gain();
	triangle.synth.volume( 3.0 * tnd );
	noise.synth.volume( 2.0 * tnd );
	dmc.synth.volume( tnd );
	
	square1 .last_amp = 0;
	square2 .last_amp = 0;
	triangle.last_amp = 0;
	noise   .last_amp = 0;
	dmc     .last_amp = 0;
}